

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
toml::detail::location<std::vector<char,_std::allocator<char>_>_>::~location
          (location<std::vector<char,_std::allocator<char>_>_> *this)

{
  location<std::vector<char,_std::allocator<char>_>_> *this_local;
  
  std::__cxx11::string::~string((string *)&this->source_name_);
  std::shared_ptr<const_std::vector<char,_std::allocator<char>_>_>::~shared_ptr(&this->source_);
  region_base::~region_base(&this->super_region_base);
  return;
}

Assistant:

~location() = default;